

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O0

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
          (PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this,
          DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
          *other)

{
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_RSI;
  DenseStorage<double,__1,__1,__1,_0> *in_RDI;
  EigenBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
  *in_stack_00000008;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_00000010;
  DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
  *in_stack_ffffffffffffffe8;
  
  MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::MatrixBase
            ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x162705);
  DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(in_RDI);
  PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::_check_template_params();
  resizeLike<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
            (in_stack_00000010,in_stack_00000008);
  _set_noalias<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
            (in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC
    EIGEN_STRONG_INLINE PlainObjectBase(const DenseBase<OtherDerived> &other)
      : m_storage()
    {
      _check_template_params();
      resizeLike(other);
      _set_noalias(other);
    }